

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

bool booster::locale::impl_icu::num_base::use_parent<float>(ios_base *ios,float v)

{
  ios_info *this;
  uint64_t uVar1;
  
  this = ios_info::get(ios);
  uVar1 = ios_info::display_flags(this);
  return uVar1 == 0;
}

Assistant:

static bool use_parent(std::ios_base &ios,ValueType v)
    {
        uint64_t flg = ios_info::get(ios).display_flags();
        if(flg == flags::posix)
            return true;
        if(details::use_parent_traits<ValueType>::use(v))
            return true;

        if(!std::numeric_limits<ValueType>::is_integer)
            return false;

        if(flg == flags::number && (ios.flags() & std::ios_base::basefield) != std::ios_base::dec) {
            return true;
        }
        return false;
    }